

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scan.h
# Opt level: O3

BOOL __thiscall
Scanner<UTF8EncodingPolicyBase<false>_>::IsIdContinueNext
          (Scanner<UTF8EncodingPolicyBase<false>_> *this,EncodedCharPtr startingLocation,
          EncodedCharPtr endOfSource)

{
  byte bVar1;
  bool bVar2;
  char16 cVar3;
  uint codePointValue;
  EncodedCharPtr local_40;
  uint local_34;
  uint local_30;
  bool local_29;
  codepoint_t nextCodepoint;
  bool ignore;
  
  if (endOfSource <= startingLocation) {
    return 0;
  }
  local_40 = startingLocation + 1;
  bVar1 = *startingLocation;
  cVar3 = (char16)bVar1;
  if ((char)bVar1 < '\0') {
    cVar3 = utf8::DecodeTail((ushort)bVar1,&local_40,endOfSource,
                             &(this->super_UTF8EncodingPolicyBase<false>).m_decodeOptions,
                             (bool *)0x0);
  }
  codePointValue = (uint)(ushort)cVar3;
  local_34 = (uint)(ushort)cVar3;
  if (local_34 < 0x80) {
    if ((codePointValue == 0x5c) &&
       (bVar2 = TryReadEscape(this,&local_40,endOfSource,&local_34), bVar2)) {
      local_29 = true;
    }
  }
  else {
    local_29 = true;
    if ((this->es6UnicodeMode == true) &&
       (bVar2 = Js::NumberUtilities::IsSurrogateLowerPart(codePointValue), bVar2)) {
      bVar2 = TryReadCodePointRest<false>
                        (this,codePointValue,&local_40,endOfSource,&local_30,&local_29);
      if (!bVar2) {
        return 0;
      }
      goto LAB_00f02dc8;
    }
  }
  local_30 = local_34;
LAB_00f02dc8:
  bVar2 = Js::CharClassifier::IsIdContinue(this->charClassifier,local_30);
  return (uint)bVar2;
}

Assistant:

inline BOOL IsIdContinueNext(EncodedCharPtr startingLocation, EncodedCharPtr endOfSource)
    {
        codepoint_t nextCodepoint;
        bool ignore;

        if (TryReadCodePoint<false>(startingLocation, endOfSource, &nextCodepoint, &ignore, &ignore))
        {
            return charClassifier->IsIdContinue(nextCodepoint);
        }

        return false;
    }